

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::find_and_replace
                   (string *__return_storage_ptr__,string *str,string *from,string *to)

{
  ulong uVar1;
  string *psVar2;
  size_t start_pos;
  string *to_local;
  string *from_local;
  string *str_local;
  
  while( true ) {
    uVar1 = ::std::__cxx11::string::find((string *)str,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)::std::__cxx11::string::length();
    ::std::__cxx11::string::replace((ulong)str,uVar1,psVar2);
    ::std::__cxx11::string::length();
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string find_and_replace(std::string str, std::string from, std::string to) {

    size_t start_pos = 0;

    while((start_pos = str.find(from, start_pos)) != std::string::npos) {
        str.replace(start_pos, from.length(), to);
        start_pos += to.length();
    }

    return str;
}